

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Token __thiscall slang::parsing::Preprocessor::expect(Preprocessor *this,TokenKind kind)

{
  TokenKind in_SI;
  long in_RDI;
  Token TVar1;
  TokenKind in_stack_00000076;
  Diagnostics *in_stack_00000078;
  BumpAllocator *in_stack_00000080;
  Token result;
  undefined1 in_stack_000000b0 [16];
  undefined1 in_stack_000000c0 [16];
  Token *in_stack_ffffffffffffff50;
  Preprocessor *in_stack_ffffffffffffff58;
  undefined8 local_70;
  undefined8 local_68;
  undefined2 local_30;
  undefined1 local_10 [16];
  
  local_10 = (undefined1  [16])peek(in_stack_ffffffffffffff58);
  local_30 = local_10._0_2_;
  if (local_30 == in_SI) {
    *(undefined8 *)(in_RDI + 0x1e8) = *(undefined8 *)(in_RDI + 0x1d8);
    *(undefined8 *)(in_RDI + 0x1f0) = *(undefined8 *)(in_RDI + 0x1e0);
    Token::Token(in_stack_ffffffffffffff50);
    *(undefined8 *)(in_RDI + 0x1d8) = local_70;
    *(undefined8 *)(in_RDI + 0x1e0) = local_68;
  }
  else {
    Token::Token(in_stack_ffffffffffffff50);
    local_10 = (undefined1  [16])
               Token::createExpected
                         (in_stack_00000080,in_stack_00000078,result,in_stack_00000076,
                          (Token)in_stack_000000b0,(Token)in_stack_000000c0);
  }
  TVar1.kind = local_10._0_2_;
  TVar1._2_1_ = local_10[2];
  TVar1.numFlags.raw = local_10[3];
  TVar1.rawLen = local_10._4_4_;
  TVar1.info = (Info *)local_10._8_8_;
  return TVar1;
}

Assistant:

Token Preprocessor::expect(TokenKind kind) {
    auto result = peek();
    if (result.kind != kind)
        return Token::createExpected(alloc, diagnostics, result, kind, lastConsumed, Token());

    lastConsumed = currentToken;
    currentToken = Token();
    return result;
}